

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::PrintCompilerAdvice
          (cmGlobalGenerator *this,ostream *os,string *lang,cmValue envVar)

{
  ostream *poVar1;
  
  std::operator<<(os,"Tell CMake where to find the compiler by setting ");
  if (envVar.Value != (string *)0x0) {
    poVar1 = std::operator<<(os,"either the environment variable \"");
    poVar1 = operator<<(poVar1,envVar);
    std::operator<<(poVar1,"\" or ");
  }
  poVar1 = std::operator<<(os,"the CMake cache entry CMAKE_");
  poVar1 = std::operator<<(poVar1,(string *)lang);
  std::operator<<(poVar1,
                  "_COMPILER to the full path to the compiler, or to the compiler name if it is in the PATH."
                 );
  return;
}

Assistant:

void cmGlobalGenerator::PrintCompilerAdvice(std::ostream& os,
                                            std::string const& lang,
                                            cmValue envVar) const
{
  // Subclasses override this method if they do not support this advice.
  os << "Tell CMake where to find the compiler by setting ";
  if (envVar) {
    os << "either the environment variable \"" << envVar << "\" or ";
  }
  os << "the CMake cache entry CMAKE_" << lang
     << "_COMPILER "
        "to the full path to the compiler, or to the compiler name "
        "if it is in the PATH.";
}